

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

void rhash_sha1_process_block(uint *hash,uint *block)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint auStack_1b8 [8];
  uint auStack_198 [5];
  uint auStack_184 [85];
  
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    uVar4 = block[lVar3];
    auStack_184[lVar3 + 3] =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  }
  for (lVar3 = 0x10; lVar3 != 0x50; lVar3 = lVar3 + 1) {
    uVar4 = auStack_198[lVar3] ^ auStack_184[lVar3] ^ auStack_1b8[lVar3 + 2] ^ auStack_1b8[lVar3];
    auStack_184[lVar3 + 3] = uVar4 << 1 | (uint)((int)uVar4 < 0);
  }
  uVar4 = hash[4];
  uVar8 = *hash;
  uVar7 = hash[1];
  uVar10 = hash[2];
  uVar6 = hash[3];
  for (lVar3 = 0; uVar9 = uVar10, uVar10 = uVar8, lVar3 != 0x14; lVar3 = lVar3 + 1) {
    lVar2 = lVar3 + 3;
    iVar11 = (uVar10 << 5 | uVar10 >> 0x1b) + uVar4;
    uVar1 = uVar7 << 0x1e;
    uVar5 = uVar7 >> 2;
    uVar4 = uVar6;
    uVar8 = iVar11 + ((uVar6 ^ uVar9) & uVar7 ^ uVar6) + auStack_184[lVar2] + 0x5a827999;
    uVar7 = uVar10;
    uVar10 = uVar1 | uVar5;
    uVar6 = uVar9;
  }
  for (lVar3 = 0x14; uVar8 = uVar9, lVar3 != 0x28; lVar3 = lVar3 + 1) {
    lVar2 = lVar3 + 3;
    iVar11 = (uVar8 ^ uVar7 ^ uVar6) + (uVar10 << 5 | uVar10 >> 0x1b) + uVar4;
    uVar9 = uVar7 << 0x1e;
    uVar1 = uVar7 >> 2;
    uVar4 = uVar6;
    uVar7 = uVar10;
    uVar9 = uVar9 | uVar1;
    uVar10 = iVar11 + auStack_184[lVar2] + 0x6ed9eba1;
    uVar6 = uVar8;
  }
  for (lVar3 = 0x28; lVar3 != 0x3c; lVar3 = lVar3 + 1) {
    uVar5 = (uVar6 | uVar8) & uVar7;
    lVar2 = lVar3 + 3;
    iVar11 = (uVar10 << 5 | uVar10 >> 0x1b) + uVar4;
    uVar9 = uVar7 << 0x1e;
    uVar1 = uVar7 >> 2;
    uVar4 = uVar6;
    uVar7 = uVar10;
    uVar10 = iVar11 + (uVar6 & uVar8 | uVar5) + auStack_184[lVar2] + 0x8f1bbcdc;
    uVar6 = uVar8;
    uVar8 = uVar9 | uVar1;
  }
  lVar3 = 0x3c;
  while( true ) {
    if (lVar3 == 0x50) break;
    lVar2 = lVar3 + 3;
    iVar11 = (uVar8 ^ uVar7 ^ uVar6) + (uVar10 << 5 | uVar10 >> 0x1b) + uVar4;
    uVar9 = uVar7 << 0x1e;
    uVar1 = uVar7 >> 2;
    lVar3 = lVar3 + 1;
    uVar4 = uVar6;
    uVar7 = uVar10;
    uVar10 = iVar11 + auStack_184[lVar2] + 0xca62c1d6;
    uVar6 = uVar8;
    uVar8 = uVar9 | uVar1;
  }
  *hash = uVar10 + *hash;
  hash[1] = uVar7 + hash[1];
  hash[2] = uVar8 + hash[2];
  hash[3] = uVar6 + hash[3];
  hash[4] = uVar4 + hash[4];
  return;
}

Assistant:

static void rhash_sha1_process_block(unsigned* hash, const unsigned* block)
{
	int           t;                 /* Loop counter */
	uint32_t      temp;              /* Temporary word value */
	uint32_t      W[80];             /* Word sequence */
	uint32_t      A, B, C, D, E;     /* Word buffers */

	/* initialize the first 16 words in the array W */
	for (t = 0; t < 16; t++) {
		/* note: it is much faster to apply be2me here, then using be32_copy */
		W[t] = be2me_32(block[t]);
	}

	/* initialize the rest */
	for (t = 16; t < 80; t++) {
		W[t] = ROTL32(W[t - 3] ^ W[t - 8] ^ W[t - 14] ^ W[t - 16], 1);
	}

	A = hash[0];
	B = hash[1];
	C = hash[2];
	D = hash[3];
	E = hash[4];

	for (t = 0; t < 20; t++) {
		/* the following is faster than ((B & C) | ((~B) & D)) */
		temp =  ROTL32(A, 5) + (((C ^ D) & B) ^ D)
			+ E + W[t] + 0x5A827999;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	for (t = 20; t < 40; t++) {
		temp = ROTL32(A, 5) + (B ^ C ^ D) + E + W[t] + 0x6ED9EBA1;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	for (t = 40; t < 60; t++) {
		temp = ROTL32(A, 5) + ((B & C) | (B & D) | (C & D))
			+ E + W[t] + 0x8F1BBCDC;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	for (t = 60; t < 80; t++) {
		temp = ROTL32(A, 5) + (B ^ C ^ D) + E + W[t] + 0xCA62C1D6;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	hash[0] += A;
	hash[1] += B;
	hash[2] += C;
	hash[3] += D;
	hash[4] += E;
}